

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servslkf.cpp
# Opt level: O2

void __thiscall
icu_63::SimpleLocaleKeyFactory::SimpleLocaleKeyFactory
          (SimpleLocaleKeyFactory *this,UObject *objToAdopt,Locale *locale,int32_t kind,
          int32_t coverage)

{
  LocaleKeyFactory::LocaleKeyFactory(&this->super_LocaleKeyFactory,coverage);
  (this->super_LocaleKeyFactory).super_ICUServiceFactory.super_UObject._vptr_UObject =
       (_func_int **)&PTR__SimpleLocaleKeyFactory_00468118;
  this->_obj = objToAdopt;
  (this->_id).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_00471e80;
  (this->_id).fUnion.fStackFields.fLengthAndFlags = 2;
  this->_kind = kind;
  LocaleUtility::initNameFromLocale(locale,&this->_id);
  return;
}

Assistant:

SimpleLocaleKeyFactory::SimpleLocaleKeyFactory(UObject* objToAdopt,
                                               const Locale& locale,
                                               int32_t kind,
                                               int32_t coverage)
  : LocaleKeyFactory(coverage)
  , _obj(objToAdopt)
  , _id()
  , _kind(kind)
{
    LocaleUtility::initNameFromLocale(locale, _id);
}